

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

Aig_Man_t * Ivy_FraigExtractCone(Ivy_Man_t *p,Ivy_Obj_t *pObj1,Ivy_Obj_t *pObj2,Vec_Int_t *vLeaves)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vNodes_00;
  Ivy_Obj_t *pIVar4;
  Aig_Man_t *p_00;
  Ivy_Obj_t *pIVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  bool bVar8;
  int local_4c;
  Ivy_Obj_t *pIStack_48;
  int i;
  Ivy_Obj_t *pObjIvy;
  Vec_Int_t *vNodes;
  Aig_Obj_t *pMiter;
  Aig_Man_t *pMan;
  Vec_Int_t *vLeaves_local;
  Ivy_Obj_t *pObj2_local;
  Ivy_Obj_t *pObj1_local;
  Ivy_Man_t *p_local;
  
  vNodes_00 = Vec_IntAlloc(100);
  pIVar4 = Ivy_ManConst1(p);
  *(uint *)&pIVar4->field_0x8 = *(uint *)&pIVar4->field_0x8 & 0xffffffdf | 0x20;
  Ivy_FraigExtractCone_rec(p,pObj1,vLeaves,vNodes_00);
  Ivy_FraigExtractCone_rec(p,pObj2,vLeaves,vNodes_00);
  pIVar4 = Ivy_ManConst1(p);
  *(uint *)&pIVar4->field_0x8 = *(uint *)&pIVar4->field_0x8 & 0xffffffdf;
  p_00 = Aig_ManStart(1000);
  pIVar4 = (Ivy_Obj_t *)Aig_ManConst1(p_00);
  pIVar5 = Ivy_ManConst1(p);
  pIVar5->pEquiv = pIVar4;
  local_4c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vLeaves);
    bVar8 = false;
    if (local_4c < iVar2) {
      iVar2 = Vec_IntEntry(vLeaves,local_4c);
      pIStack_48 = Ivy_ManObj(p,iVar2);
      bVar8 = pIStack_48 != (Ivy_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pIVar4 = (Ivy_Obj_t *)Aig_ObjCreateCi(p_00);
    pIStack_48->pEquiv = pIVar4;
    *(uint *)&pIStack_48->field_0x8 = *(uint *)&pIStack_48->field_0x8 & 0xffffffdf;
    local_4c = local_4c + 1;
  }
  local_4c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vNodes_00);
    bVar8 = false;
    if (local_4c < iVar2) {
      iVar2 = Vec_IntEntry(vNodes_00,local_4c);
      pIStack_48 = Ivy_ManObj(p,iVar2);
      bVar8 = pIStack_48 != (Ivy_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pIVar4 = Ivy_ObjChild0Equiv(pIStack_48);
    pIVar5 = Ivy_ObjChild1Equiv(pIStack_48);
    pIVar4 = (Ivy_Obj_t *)Aig_And(p_00,(Aig_Obj_t *)pIVar4,(Aig_Obj_t *)pIVar5);
    pIStack_48->pEquiv = pIVar4;
    *(uint *)&pIStack_48->field_0x8 = *(uint *)&pIStack_48->field_0x8 & 0xffffffdf;
    if (((uint)((ulong)pIStack_48->pEquiv->pFanin1 >> 3) & 1) !=
        (*(uint *)&pIStack_48->field_0x8 >> 7 & 1)) {
      __assert_fail("pMiter->fPhase == pObjIvy->fPhase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0xb50,
                    "Aig_Man_t *Ivy_FraigExtractCone(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Vec_Int_t *)"
                   );
    }
    local_4c = local_4c + 1;
  }
  pAVar6 = Aig_Exor(p_00,(Aig_Obj_t *)pObj1->pEquiv,(Aig_Obj_t *)pObj2->pEquiv);
  pAVar7 = Aig_Regular(pAVar6);
  uVar1 = *(ulong *)&pAVar7->field_0x18;
  uVar3 = Aig_IsComplement(pAVar6);
  pAVar6 = Aig_NotCond(pAVar6,(uint)(uVar1 >> 3) & 1 ^ uVar3);
  Aig_ObjCreateCo(p_00,pAVar6);
  Aig_ManCleanup(p_00);
  Vec_IntFree(vNodes_00);
  return p_00;
}

Assistant:

Aig_Man_t * Ivy_FraigExtractCone( Ivy_Man_t * p, Ivy_Obj_t * pObj1, Ivy_Obj_t * pObj2, Vec_Int_t * vLeaves )
{
    Aig_Man_t * pMan;
    Aig_Obj_t * pMiter;
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObjIvy;
    int i;
    // collect nodes
    vNodes  = Vec_IntAlloc( 100 );
    Ivy_ManConst1(p)->fMarkB = 1;
    Ivy_FraigExtractCone_rec( p, pObj1, vLeaves, vNodes );
    Ivy_FraigExtractCone_rec( p, pObj2, vLeaves, vNodes );
    Ivy_ManConst1(p)->fMarkB = 0;
    // create new manager
    pMan = Aig_ManStart( 1000 );
    Ivy_ManConst1(p)->pEquiv = (Ivy_Obj_t *)Aig_ManConst1(pMan);
    Ivy_ManForEachNodeVec( p, vLeaves, pObjIvy, i )
    {
        pObjIvy->pEquiv = (Ivy_Obj_t *)Aig_ObjCreateCi( pMan );
        pObjIvy->fMarkB = 0;
    }
    // duplicate internal nodes
    Ivy_ManForEachNodeVec( p, vNodes, pObjIvy, i )
    {

        pObjIvy->pEquiv = (Ivy_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Ivy_ObjChild0Equiv(pObjIvy), (Aig_Obj_t *)Ivy_ObjChild1Equiv(pObjIvy) );
        pObjIvy->fMarkB = 0;

        pMiter = (Aig_Obj_t *)pObjIvy->pEquiv;
        assert( pMiter->fPhase == pObjIvy->fPhase );
    }
    // create the PO
    pMiter = Aig_Exor( pMan, (Aig_Obj_t *)pObj1->pEquiv, (Aig_Obj_t *)pObj2->pEquiv );
    pMiter = Aig_NotCond( pMiter, Aig_Regular(pMiter)->fPhase ^ Aig_IsComplement(pMiter) );

/*
printf( "Polarity = %d\n", pMiter->fPhase );
    if ( Ivy_ObjIsConst1(pObj1) || Ivy_ObjIsConst1(pObj2) )
    {
        pMiter = Aig_NotCond( pMiter, 1 );
printf( "***************\n" );
    }
*/
    pMiter = Aig_ObjCreateCo( pMan, pMiter );
//printf( "Polarity = %d\n", pMiter->fPhase );
    Aig_ManCleanup( pMan );
    Vec_IntFree( vNodes );
    return pMan;
}